

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::CreatedTransactionResult> *
wallet::CreateTransaction
          (Result<wallet::CreatedTransactionResult> *__return_storage_ptr__,CWallet *wallet,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend,
          optional<unsigned_int> change_pos,CCoinControl *coin_control,bool sign)

{
  pointer pCVar1;
  long lVar2;
  T *pTVar3;
  T *pTVar4;
  long lVar5;
  pointer pCVar6;
  pointer pCVar7;
  bilingual_str *this;
  char *parameters_2;
  long lVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  CCoinControl tmp_cc;
  Result<wallet::CreatedTransactionResult> res;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (vecSend->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (vecSend->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar7 == pCVar1) {
    _(&local_78,(ConstevalStringLiteral)0xe2215f);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult> *)
               __return_storage_ptr__,&local_78);
    this = &local_78;
LAB_0098df02:
    bilingual_str::~bilingual_str(this);
    goto LAB_0098e09e;
  }
  lVar5 = (long)pCVar1 - (long)pCVar7;
  pCVar7 = pCVar7 + 2;
  for (lVar2 = lVar5 / 0x60 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (pCVar7[-2].nAmount < 0) {
      pCVar6 = pCVar7 + -2;
      goto LAB_0098ded3;
    }
    if (pCVar7[-1].nAmount < 0) {
      pCVar6 = pCVar7 + -1;
      goto LAB_0098ded3;
    }
    pCVar6 = pCVar7;
    if (pCVar7->nAmount < 0) goto LAB_0098ded3;
    if (pCVar7[1].nAmount < 0) {
      pCVar6 = pCVar7 + 1;
      goto LAB_0098ded3;
    }
    pCVar7 = pCVar7 + 4;
    lVar5 = lVar5 + -0x180;
  }
  lVar5 = lVar5 / 0x60;
  pCVar6 = pCVar7 + -2;
  if (lVar5 == 1) {
LAB_0098e0eb:
    if (-1 < pCVar6->nAmount) {
      pCVar6 = pCVar1;
    }
LAB_0098ded3:
    if (pCVar6 != pCVar1) {
      _(&local_b8,(ConstevalStringLiteral)0xe1a225);
      std::__detail::__variant::
      _Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::CreatedTransactionResult> *)
                 __return_storage_ptr__,&local_b8);
      this = &local_b8;
      goto LAB_0098df02;
    }
  }
  else {
    if (lVar5 == 3) {
      if (-1 < pCVar7[-2].nAmount) {
        pCVar6 = pCVar7 + -1;
        goto LAB_0098e0dc;
      }
      goto LAB_0098ded3;
    }
    if (lVar5 == 2) {
LAB_0098e0dc:
      if (-1 < pCVar6->nAmount) {
        pCVar6 = pCVar6 + 1;
        goto LAB_0098e0eb;
      }
      goto LAB_0098ded3;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock3,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
             ,0x562,false);
  CreateTransactionInternal(&res,wallet,vecSend,change_pos,coin_control,sign);
  if ((((res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
         '\x01') &&
       (pTVar3 = util::Result<wallet::CreatedTransactionResult>::value(&res), 0 < pTVar3->fee)) &&
      (-1 < wallet->m_max_aps_fee)) && (coin_control->m_avoid_partial_spends == false)) {
    CCoinControl::CCoinControl(&tmp_cc,coin_control);
    tmp_cc.m_avoid_partial_spends = true;
    if ((pTVar3->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      ExtractDestination((CScript *)
                         ((long)(((pTVar3->tx).
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                          (ulong)(pTVar3->change_pos).super__Optional_base<unsigned_int,_true,_true>
                                 ._M_payload.super__Optional_payload_base<unsigned_int>._M_payload.
                                 _M_value * 0x28 + 8),&tmp_cc.destChange);
    }
    CreateTransactionInternal(__return_storage_ptr__,wallet,vecSend,change_pos,&tmp_cc,sign);
    if ((*(__index_type *)
          ((long)&(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> +
          0xa0) != '\x01') ||
       (pTVar4 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__),
       *(__index_type *)
        ((long)&(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> + 0xa0
        ) != '\x01')) {
LAB_0098e065:
      std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                 __return_storage_ptr__);
      CCoinControl::~CCoinControl(&tmp_cc);
      goto LAB_0098e077;
    }
    lVar2 = pTVar4->fee;
    lVar5 = pTVar3->fee;
    lVar8 = wallet->m_max_aps_fee + lVar5;
    pTVar3 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__);
    parameters_2 = "grouped";
    if (lVar8 < lVar2) {
      parameters_2 = "non-grouped";
    }
    CWallet::WalletLogPrintf<long,long,char_const*>
              (wallet,"Fee non-grouped = %lld, grouped = %lld, using %s\n",lVar5,pTVar3->fee,
               parameters_2);
    if (lVar8 < lVar2) goto LAB_0098e065;
    CCoinControl::~CCoinControl(&tmp_cc);
  }
  else {
LAB_0098e077:
    std::__detail::__variant::
    _Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult>::_Move_ctor_base
              ((_Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
               __return_storage_ptr__,
               (_Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult> *)&res);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      &res);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
LAB_0098e09e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CreatedTransactionResult> CreateTransaction(
        CWallet& wallet,
        const std::vector<CRecipient>& vecSend,
        std::optional<unsigned int> change_pos,
        const CCoinControl& coin_control,
        bool sign)
{
    if (vecSend.empty()) {
        return util::Error{_("Transaction must have at least one recipient")};
    }

    if (std::any_of(vecSend.cbegin(), vecSend.cend(), [](const auto& recipient){ return recipient.nAmount < 0; })) {
        return util::Error{_("Transaction amounts must not be negative")};
    }

    LOCK(wallet.cs_wallet);

    auto res = CreateTransactionInternal(wallet, vecSend, change_pos, coin_control, sign);
    TRACE4(coin_selection, normal_create_tx_internal,
           wallet.GetName().c_str(),
           bool(res),
           res ? res->fee : 0,
           res && res->change_pos.has_value() ? int32_t(*res->change_pos) : -1);
    if (!res) return res;
    const auto& txr_ungrouped = *res;
    // try with avoidpartialspends unless it's enabled already
    if (txr_ungrouped.fee > 0 /* 0 means non-functional fee rate estimation */ && wallet.m_max_aps_fee > -1 && !coin_control.m_avoid_partial_spends) {
        TRACE1(coin_selection, attempting_aps_create_tx, wallet.GetName().c_str());
        CCoinControl tmp_cc = coin_control;
        tmp_cc.m_avoid_partial_spends = true;

        // Reuse the change destination from the first creation attempt to avoid skipping BIP44 indexes
        if (txr_ungrouped.change_pos) {
            ExtractDestination(txr_ungrouped.tx->vout[*txr_ungrouped.change_pos].scriptPubKey, tmp_cc.destChange);
        }

        auto txr_grouped = CreateTransactionInternal(wallet, vecSend, change_pos, tmp_cc, sign);
        // if fee of this alternative one is within the range of the max fee, we use this one
        const bool use_aps{txr_grouped.has_value() ? (txr_grouped->fee <= txr_ungrouped.fee + wallet.m_max_aps_fee) : false};
        TRACE5(coin_selection, aps_create_tx_internal,
               wallet.GetName().c_str(),
               use_aps,
               txr_grouped.has_value(),
               txr_grouped.has_value() ? txr_grouped->fee : 0,
               txr_grouped.has_value() && txr_grouped->change_pos.has_value() ? int32_t(*txr_grouped->change_pos) : -1);
        if (txr_grouped) {
            wallet.WalletLogPrintf("Fee non-grouped = %lld, grouped = %lld, using %s\n",
                txr_ungrouped.fee, txr_grouped->fee, use_aps ? "grouped" : "non-grouped");
            if (use_aps) return txr_grouped;
        }
    }
    return res;
}